

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_glsl.cpp
# Opt level: O0

void LoadAndCompileShader(GLuint shader,char *text)

{
  GLsizei local_40c;
  GLchar local_408 [4];
  GLsizei len;
  GLchar log [1000];
  GLint stat;
  GLint length;
  char *text_local;
  GLuint shader_local;
  
  log[0x3e4] = -1;
  log[0x3e5] = -1;
  log[0x3e6] = -1;
  log[999] = -1;
  _stat = text;
  text_local._4_4_ = shader;
  (*glad_glShaderSource)(shader,1,(GLchar **)&stat,(GLint *)(log + 0x3e4));
  (*glad_glCompileShader)(text_local._4_4_);
  (*glad_glGetShaderiv)(text_local._4_4_,0x8b81,(GLint *)(log + 0x3e0));
  if (log._992_4_ == 0) {
    (*glad_glGetShaderInfoLog)(text_local._4_4_,1000,&local_40c,local_408);
    fprintf(_stderr,"fslight: problem compiling shader:\n%s\n",local_408);
    exit(1);
  }
  return;
}

Assistant:

static void
LoadAndCompileShader(GLuint shader, const char *text)
{
   const GLint length = -1;
   GLint stat;

   glShaderSource(shader, 1, (const GLchar **) &text, &length);

   glCompileShader(shader);

   glGetShaderiv(shader, GL_COMPILE_STATUS, &stat);
   if (!stat) {
      GLchar log[1000];
      GLsizei len;
      glGetShaderInfoLog(shader, 1000, &len, log);
      fprintf(stderr, "fslight: problem compiling shader:\n%s\n", log);
      exit(1);
   }
}